

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

bool __thiscall cmListFile::ParseFile(cmListFile *this,char *filename,bool topLevel,cmMakefile *mf)

{
  pointer *__return_storage_ptr__;
  char *pcVar1;
  bool bVar2;
  size_type sVar3;
  pointer pcVar4;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  bool local_511;
  __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
  local_508;
  const_iterator local_500;
  allocator local_4f1;
  string local_4f0;
  undefined1 local_4d0 [8];
  cmListFileArgument prj;
  cmListFileFunction project;
  __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
  local_420;
  __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
  local_418;
  iterator i_2;
  bool hasProject;
  iterator iStack_408;
  _Self local_400;
  undefined1 local_3f8 [8];
  string name;
  __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
  local_3d0;
  iterator i_1;
  allocator local_3b1;
  value_type local_3b0;
  _Base_ptr local_390;
  undefined1 local_388;
  allocator local_379;
  value_type local_378;
  _Base_ptr local_358;
  undefined1 local_350;
  allocator local_341;
  value_type local_340;
  _Base_ptr local_320;
  undefined1 local_318;
  allocator local_309;
  value_type local_308;
  _Base_ptr local_2e8;
  undefined1 local_2e0;
  allocator local_2d1;
  value_type local_2d0;
  _Base_ptr local_2b0;
  undefined1 local_2a8;
  allocator local_299;
  value_type local_298;
  _Base_ptr local_278;
  undefined1 local_270;
  allocator local_261;
  value_type local_260;
  _Base_ptr local_240;
  undefined1 local_238;
  allocator local_229;
  value_type local_228;
  _Base_ptr local_208;
  undefined1 local_200;
  allocator local_1f1;
  value_type local_1f0;
  _Base_ptr local_1d0;
  undefined1 local_1c8;
  allocator local_1b9;
  value_type local_1b8;
  _Base_ptr local_198;
  undefined1 local_190;
  allocator local_181;
  value_type local_180;
  undefined1 local_160 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allowedCommands;
  undefined1 local_128 [7];
  bool isProblem;
  __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
  local_108;
  __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
  local_100;
  iterator i;
  undefined1 local_f0 [7];
  bool hasVersion;
  cmListFileParser parser;
  bool parseError;
  allocator local_51;
  string local_50;
  cmMakefile *local_30;
  cmMakefile *mf_local;
  char *pcStack_20;
  bool topLevel_local;
  char *filename_local;
  cmListFile *this_local;
  
  local_30 = mf;
  mf_local._7_1_ = topLevel;
  pcStack_20 = filename;
  filename_local = (char *)this;
  bVar2 = cmsys::SystemTools::FileExists(filename);
  pcVar1 = pcStack_20;
  parser.Separation._3_1_ = SeparationOkay >> 0x18;
  local_511 = true;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,pcVar1,&local_51);
    parser.Separation._3_1_ = 1;
    local_511 = cmsys::SystemTools::FileIsDirectory(&local_50);
  }
  if ((parser.Separation._3_1_ & 1) != SeparationOkay >> 0x18) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (bVar2) {
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  if (local_511 == false) {
    parser.Separation._2_1_ = SeparationOkay >> 0x10;
    cmListFileParser::cmListFileParser((cmListFileParser *)local_f0,this,local_30,pcStack_20);
    bVar2 = cmListFileParser::ParseFile((cmListFileParser *)local_f0);
    parser.Separation._2_1_ = (bVar2 ^ 0xff) & 1;
    cmListFileParser::~cmListFileParser((cmListFileParser *)local_f0);
    if ((mf_local._7_1_ & 1) != 0) {
      i._M_current._7_1_ = 0;
      local_100._M_current =
           (cmListFileFunction *)
           std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                     (&this->Functions);
      while( true ) {
        local_108._M_current =
             (cmListFileFunction *)
             std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                       (&this->Functions);
        bVar2 = __gnu_cxx::operator!=(&local_100,&local_108);
        if (!bVar2) break;
        pcVar4 = __gnu_cxx::
                 __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                 ::operator->(&local_100);
        cmsys::SystemTools::LowerCase((string *)local_128,(string *)pcVar4);
        bVar2 = std::operator==((string *)local_128,"cmake_minimum_required");
        std::__cxx11::string::~string((string *)local_128);
        if (bVar2) {
          i._M_current._7_1_ = 1;
          break;
        }
        __gnu_cxx::
        __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
        ::operator++(&local_100);
      }
      if ((i._M_current._7_1_ & 1) == 0) {
        allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
        sVar3 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::size
                          (&this->Functions);
        if (sVar3 < 0x1e) {
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_160);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_180,"project",&local_181);
          pVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_160,&local_180);
          local_198 = (_Base_ptr)pVar5.first._M_node;
          local_190 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_180);
          std::allocator<char>::~allocator((allocator<char> *)&local_181);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1b8,"set",&local_1b9);
          pVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_160,&local_1b8);
          local_1d0 = (_Base_ptr)pVar5.first._M_node;
          local_1c8 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_1b8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1f0,"if",&local_1f1);
          pVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_160,&local_1f0);
          local_208 = (_Base_ptr)pVar5.first._M_node;
          local_200 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_1f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_228,"endif",&local_229);
          pVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_160,&local_228);
          local_240 = (_Base_ptr)pVar5.first._M_node;
          local_238 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_228);
          std::allocator<char>::~allocator((allocator<char> *)&local_229);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_260,"else",&local_261);
          pVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_160,&local_260);
          local_278 = (_Base_ptr)pVar5.first._M_node;
          local_270 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_260);
          std::allocator<char>::~allocator((allocator<char> *)&local_261);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_298,"elseif",&local_299);
          pVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_160,&local_298);
          local_2b0 = (_Base_ptr)pVar5.first._M_node;
          local_2a8 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_298);
          std::allocator<char>::~allocator((allocator<char> *)&local_299);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_2d0,"add_executable",&local_2d1);
          pVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_160,&local_2d0);
          local_2e8 = (_Base_ptr)pVar5.first._M_node;
          local_2e0 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_2d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_308,"add_library",&local_309);
          pVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_160,&local_308);
          local_320 = (_Base_ptr)pVar5.first._M_node;
          local_318 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_308);
          std::allocator<char>::~allocator((allocator<char> *)&local_309);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_340,"target_link_libraries",&local_341);
          pVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_160,&local_340);
          local_358 = (_Base_ptr)pVar5.first._M_node;
          local_350 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_340);
          std::allocator<char>::~allocator((allocator<char> *)&local_341);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_378,"option",&local_379);
          pVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_160,&local_378);
          local_390 = (_Base_ptr)pVar5.first._M_node;
          local_388 = pVar5.second;
          std::__cxx11::string::~string((string *)&local_378);
          std::allocator<char>::~allocator((allocator<char> *)&local_379);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_3b0,"message",&local_3b1);
          pVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_160,&local_3b0);
          i_1._M_current = (cmListFileFunction *)pVar5.first._M_node;
          std::__cxx11::string::~string((string *)&local_3b0);
          std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
          allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
          local_3d0._M_current =
               (cmListFileFunction *)
               std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                         (&this->Functions);
          while( true ) {
            name.field_2._8_8_ =
                 std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                           (&this->Functions);
            bVar2 = __gnu_cxx::operator!=
                              (&local_3d0,
                               (__normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                                *)((long)&name.field_2 + 8));
            if (!bVar2) break;
            pcVar4 = __gnu_cxx::
                     __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                     ::operator->(&local_3d0);
            cmsys::SystemTools::LowerCase((string *)local_3f8,(string *)pcVar4);
            local_400._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_160,(key_type *)local_3f8);
            iStack_408 = std::
                         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_160);
            bVar2 = std::operator==(&local_400,&stack0xfffffffffffffbf8);
            if (bVar2) {
              allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
              i_2._M_current._4_4_ = 5;
            }
            else {
              i_2._M_current._4_4_ = 0;
            }
            std::__cxx11::string::~string((string *)local_3f8);
            if (i_2._M_current._4_4_ != 0) break;
            __gnu_cxx::
            __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
            ::operator++(&local_3d0);
          }
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_160);
        }
        if ((allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
          cmMakefile::SetCheckCMP0000(local_30,true);
          cmMakefile::SetPolicyVersion(local_30,"2.4");
        }
      }
    }
    if ((mf_local._7_1_ & 1) != 0) {
      i_2._M_current._3_1_ = 0;
      local_418._M_current =
           (cmListFileFunction *)
           std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                     (&this->Functions);
      while( true ) {
        local_420._M_current =
             (cmListFileFunction *)
             std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                       (&this->Functions);
        bVar2 = __gnu_cxx::operator!=(&local_418,&local_420);
        if (!bVar2) break;
        pcVar4 = __gnu_cxx::
                 __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                 ::operator->(&local_418);
        __return_storage_ptr__ =
             &project.Arguments.
              super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
        cmsys::SystemTools::LowerCase((string *)__return_storage_ptr__,(string *)pcVar4);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__return_storage_ptr__,"project");
        std::__cxx11::string::~string
                  ((string *)
                   &project.Arguments.
                    super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar2) {
          i_2._M_current._3_1_ = 1;
          break;
        }
        __gnu_cxx::
        __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
        ::operator++(&local_418);
      }
      if ((i_2._M_current._3_1_ & 1) == 0) {
        cmListFileFunction::cmListFileFunction((cmListFileFunction *)&prj.Line);
        std::__cxx11::string::operator=((string *)&prj.Line,"PROJECT");
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_4f0,"Project",&local_4f1);
        cmListFileArgument::cmListFileArgument
                  ((cmListFileArgument *)local_4d0,&local_4f0,Unquoted,0);
        std::__cxx11::string::~string((string *)&local_4f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
        std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
                  ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
                   &project.super_cmListFileContext.Line,(value_type *)local_4d0);
        local_508._M_current =
             (cmListFileFunction *)
             std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                       (&this->Functions);
        __gnu_cxx::
        __normal_iterator<cmListFileFunction_const*,std::vector<cmListFileFunction,std::allocator<cmListFileFunction>>>
        ::__normal_iterator<cmListFileFunction*>
                  ((__normal_iterator<cmListFileFunction_const*,std::vector<cmListFileFunction,std::allocator<cmListFileFunction>>>
                    *)&local_500,&local_508);
        std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::insert
                  (&this->Functions,local_500,(value_type *)&prj.Line);
        cmListFileArgument::~cmListFileArgument((cmListFileArgument *)local_4d0);
        cmListFileFunction::~cmListFileFunction((cmListFileFunction *)&prj.Line);
      }
    }
    if ((parser.Separation._2_1_ & 1) == SeparationOkay >> 0x10) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmListFile::ParseFile(const char* filename,
                           bool topLevel,
                           cmMakefile *mf)
{
  if(!cmSystemTools::FileExists(filename) ||
     cmSystemTools::FileIsDirectory(filename))
    {
    return false;
    }

  bool parseError = false;

  {
  cmListFileParser parser(this, mf, filename);
  parseError = !parser.ParseFile();
  }

  // do we need a cmake_policy(VERSION call?
  if(topLevel)
  {
    bool hasVersion = false;
    // search for the right policy command
    for(std::vector<cmListFileFunction>::iterator i
          = this->Functions.begin();
        i != this->Functions.end(); ++i)
    {
      if (cmSystemTools::LowerCase(i->Name) == "cmake_minimum_required")
      {
        hasVersion = true;
        break;
      }
    }
    // if no policy command is found this is an error if they use any
    // non advanced functions or a lot of functions
    if(!hasVersion)
    {
      bool isProblem = true;
      if (this->Functions.size() < 30)
      {
        // the list of simple commands DO NOT ADD TO THIS LIST!!!!!
        // these commands must have backwards compatibility forever and
        // and that is a lot longer than your tiny mind can comprehend mortal
        std::set<std::string> allowedCommands;
        allowedCommands.insert("project");
        allowedCommands.insert("set");
        allowedCommands.insert("if");
        allowedCommands.insert("endif");
        allowedCommands.insert("else");
        allowedCommands.insert("elseif");
        allowedCommands.insert("add_executable");
        allowedCommands.insert("add_library");
        allowedCommands.insert("target_link_libraries");
        allowedCommands.insert("option");
        allowedCommands.insert("message");
        isProblem = false;
        for(std::vector<cmListFileFunction>::iterator i
              = this->Functions.begin();
            i != this->Functions.end(); ++i)
        {
          std::string name = cmSystemTools::LowerCase(i->Name);
          if (allowedCommands.find(name) == allowedCommands.end())
          {
            isProblem = true;
            break;
          }
        }
      }

      if (isProblem)
      {
      // Tell the top level cmMakefile to diagnose
      // this violation of CMP0000.
      mf->SetCheckCMP0000(true);

      // Implicitly set the version for the user.
      mf->SetPolicyVersion("2.4");
      }
    }
  }

  if(topLevel)
    {
    bool hasProject = false;
    // search for a project command
    for(std::vector<cmListFileFunction>::iterator i
          = this->Functions.begin();
        i != this->Functions.end(); ++i)
      {
      if(cmSystemTools::LowerCase(i->Name) == "project")
        {
        hasProject = true;
        break;
        }
      }
    // if no project command is found, add one
    if(!hasProject)
      {
      cmListFileFunction project;
      project.Name = "PROJECT";
      cmListFileArgument prj("Project", cmListFileArgument::Unquoted, 0);
      project.Arguments.push_back(prj);
      this->Functions.insert(this->Functions.begin(),project);
      }
    }
  if(parseError)
    {
    return false;
    }
  return true;
}